

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *this,
          unsigned_short propertyIndex,WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> WVar3;
  PropertyAttributes attributes_00;
  bool bVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000009;
  WriteBarrierPtr<const_Js::PropertyRecord> local_60;
  WriteBarrierPtr<const_Js::PropertyRecord> local_58;
  DynamicTypeHandler *local_50;
  WriteBarrierPtr<const_Js::PropertyRecord> *local_48;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_40;
  undefined4 local_38;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34;
  
  local_40.ptr = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyKey->ptr;
  if (local_40.ptr != (PrototypeChainCache<Js::NoSpecialPropertyCache> *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_38 = (undefined4)CONCAT71(in_register_00000009,attributes);
    local_34.Attributes = attributes;
    local_34.propertyIndex = propertyIndex;
    if ((isFixed || usedAsFixed) &&
       ((*(uint *)&((local_40.ptr)->types).
                   super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.buffer.ptr <
         0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      local_50 = (DynamicTypeHandler *)this;
      local_48 = propertyKey;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      local_40.ptr = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)local_48->ptr;
      this = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
             local_50;
      propertyKey = local_48;
    }
    if ((*(uint *)&((local_40.ptr)->types).
                   super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.buffer.ptr <
         0x10) ||
       (*(char *)((long)&((local_40.ptr)->types).
                         super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.count + 2
                 ) == '\x01')) {
      *(byte *)&((DynamicTypeHandler *)((long)this + 0x18))->unusedBytes =
           (byte)((DynamicTypeHandler *)((long)this + 0x18))->unusedBytes | 4;
      local_40.ptr = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyKey->ptr;
    }
    local_34._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                *)((DynamicTypeHandler *)((long)this + 0x18))->_vptr_DynamicTypeHandler,
               (PropertyRecord **)&local_40,&local_34);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_40,&pJVar1->typesWithNoSpecialPropertyProtoChain);
    WVar3.ptr = local_40.ptr;
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_58,propertyKey);
    attributes_00 = (PropertyAttributes)local_38;
    PrototypeChainCache<Js::NoSpecialPropertyCache>::
    ProcessProperty<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
              (WVar3.ptr,(DynamicTypeHandler *)this,(PropertyAttributes)local_38,&local_58,
               scriptContext);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_40,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
    WVar3.ptr = local_40.ptr;
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_60,propertyKey);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::
    ProcessProperty<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)WVar3.ptr,
               (DynamicTypeHandler *)this,attributes_00,&local_60,scriptContext);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }